

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperSuper.c
# Opt level: O3

int Map_LibraryRead(Map_SuperLib_t *pLib,char *pFileName)

{
  byte bVar1;
  Extra_MmFlex_t *p;
  uint (*uTruthsIn) [2];
  int iVar2;
  uint uVar3;
  uint uVar4;
  FILE *__stream;
  char *pcVar5;
  ulong uVar6;
  FILE *__stream_00;
  Mio_Library_t *pMVar7;
  ProgressBar *p_00;
  Map_Super_t *pGate;
  size_t sVar8;
  char *pcVar9;
  char cVar10;
  long lVar11;
  byte *__s;
  uint uVar12;
  byte *pbVar13;
  double dVar14;
  int nGatesTotal;
  uint uTruthRes [2];
  char Buffer [1000];
  char pBuffer [5000];
  uint local_17cc;
  uint local_17c8;
  uint local_17c4;
  ProgressBar *local_17c0;
  uint (*local_17b8) [2];
  uint local_17b0 [2];
  char local_17a8 [1008];
  byte local_13b8 [5000];
  
  if (pLib->pGenlib != (Mio_Library_t *)0x0) {
    __assert_fail("pLib->pGenlib == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                  ,0x37,"int Map_LibraryRead(Map_SuperLib_t *, char *)");
  }
  __stream = fopen(pFileName,"r");
  if (__stream == (FILE *)0x0) {
    printf("Cannot open input file \"%s\".\n",pFileName);
    return 0;
  }
  pcVar5 = fgets((char *)local_13b8,2000,__stream);
  pbVar13 = local_13b8;
  if (pcVar5 == (char *)0x0) {
    __s = (byte *)0x0;
  }
  else {
    while (__s = pbVar13, uVar6 = (ulong)*__s, uVar6 < 0x24) {
      if ((0x100002400U >> (uVar6 & 0x3f) & 1) == 0) {
        if (((0x800000001U >> (uVar6 & 0x3f) & 1) == 0) ||
           (pcVar5 = fgets((char *)local_13b8,2000,__stream), pbVar13 = local_13b8,
           pcVar5 == (char *)0x0)) break;
      }
      else {
        pbVar13 = __s + 1;
      }
    }
  }
  pcVar5 = strtok((char *)__s," \t\r\n");
  iVar2 = strcmp(pcVar5,"GATE");
  if (iVar2 == 0) {
    pcVar5 = pLib->pName;
    pcVar9 = "The input file \"%s\" looks like a genlib file and not a supergate library file.\n";
  }
  else {
    __stream_00 = fopen(pcVar5,"r");
    if (__stream_00 == (FILE *)0x0) {
      pcVar9 = "Cannot open the genlib file \"%s\".\n";
    }
    else {
      fclose(__stream_00);
      pMVar7 = Mio_LibraryRead(pcVar5,(char *)0x0,(char *)0x0,0);
      pLib->pGenlib = pMVar7;
      if (pMVar7 != (Mio_Library_t *)0x0) {
        __isoc99_fscanf(__stream,"%d\n",&pLib->nVarsMax);
        if (pLib->nVarsMax - 0xbU < 0xfffffff7) {
          pcVar5 = "Suspicious number of variables (%d).\n";
        }
        else {
          __isoc99_fscanf(__stream,"%d\n",&local_17cc);
          if (0xff67697f < local_17cc - 0x989681) {
            p_00 = Extra_ProgressBarStart(_stdout,local_17cc);
            pcVar5 = fgets((char *)local_13b8,5000,__stream);
            uVar12 = 0;
            if (pcVar5 != (char *)0x0) {
              local_17b8 = pLib->uTruths;
              uVar4 = 0;
              do {
                pbVar13 = local_13b8;
                while( true ) {
                  while (bVar1 = *pbVar13, bVar1 < 0xd) {
                    if (bVar1 != 0) {
                      if (bVar1 == 10) goto LAB_00400673;
                      goto LAB_0040069c;
                    }
                    pcVar5 = fgets((char *)local_13b8,5000,__stream);
                    pbVar13 = local_13b8;
                    uVar12 = uVar4;
                    if (pcVar5 == (char *)0x0) goto LAB_00400945;
                  }
                  if ((bVar1 != 0x20) && (bVar1 != 0xd)) break;
LAB_00400673:
                  pbVar13 = pbVar13 + 1;
                }
LAB_0040069c:
                uVar12 = pLib->nVarsMax;
                local_17c0 = p_00;
                pGate = (Map_Super_t *)Extra_MmFixedEntryFetch(pLib->mmSupers);
                memset(pGate,0,0x100);
                pcVar5 = strtok((char *)pbVar13," ");
                iVar2 = atoi(pcVar5);
                pGate->Num = iVar2;
                pcVar5 = strtok((char *)0x0," ");
                if (pLib->nVarsMax < 6) {
                  uVar3 = Extra_ReadBinary(pcVar5);
                  pGate->uTruth[0] = uVar3;
                  uVar3 = 0;
                }
                else {
                  uVar3 = Extra_ReadBinary(pcVar5 + 0x20);
                  pGate->uTruth[0] = uVar3;
                  pcVar5[0x20] = '\0';
                  uVar3 = Extra_ReadBinary(pcVar5);
                }
                pGate->uTruth[1] = uVar3;
                pcVar5 = strtok((char *)0x0," ");
                dVar14 = atof(pcVar5);
                (pGate->tDelayMax).Rise = (float)dVar14;
                (pGate->tDelayMax).Fall = (float)dVar14;
                if (0 < (int)uVar12) {
                  lVar11 = 0;
                  do {
                    pcVar5 = strtok((char *)0x0," ");
                    dVar14 = atof(pcVar5);
                    *(float *)((long)&pGate->tDelaysR[0].Rise + lVar11) = (float)dVar14;
                    *(float *)((long)&pGate->tDelaysF[0].Fall + lVar11) = (float)dVar14;
                    lVar11 = lVar11 + 0xc;
                  } while ((ulong)uVar12 * 0xc != lVar11);
                }
                pcVar5 = strtok((char *)0x0," ");
                dVar14 = atof(pcVar5);
                pGate->Area = (float)dVar14;
                pcVar5 = strtok((char *)0x0," \r\n");
                if (*pcVar5 == '\0') {
                  puts("A gate name is empty.");
                }
                p = pLib->mmForms;
                sVar8 = strlen(pcVar5);
                pcVar9 = Extra_MmFlexEntryFetch(p,(int)sVar8 + 1);
                pGate->pFormula = pcVar9;
                strcpy(pcVar9,pcVar5);
                pcVar5 = strtok((char *)0x0," \n");
                if (pcVar5 != (char *)0x0) {
                  printf("The following trailing symbols found \"%s\".\n",pcVar5);
                }
                uTruthsIn = local_17b8;
                uVar12 = pGate->Num;
                if (uVar12 != uVar4 + 1) {
                  __assert_fail("pGate->Num == nCounter + 1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                                ,0x97,"int Map_LibraryReadFile(Map_SuperLib_t *, FILE *)");
                }
                pcVar5 = pGate->pFormula;
                cVar10 = *pcVar5;
                if (cVar10 != '\0') {
                  uVar4 = *(uint *)&pGate->field_0x4;
                  pcVar9 = pcVar5;
                  do {
                    pcVar9 = pcVar9 + 1;
                    uVar4 = uVar4 & 0xffffff1f | (uint)(cVar10 == '(') * 0x20 + uVar4 & 0xe0;
                    *(uint *)&pGate->field_0x4 = uVar4;
                    cVar10 = *pcVar9;
                  } while (cVar10 != '\0');
                }
                strcpy(local_17a8,pcVar5);
                Map_LibraryComputeTruth_rec(pLib,local_17a8,uTruthsIn,&local_17c8);
                if ((local_17c8 != pGate->uTruth[0]) || (local_17c4 != pGate->uTruth[1])) {
                  __assert_fail("Map_LibraryTruthVerify(pLib, pGate)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperSuper.c"
                                ,0x9c,"int Map_LibraryReadFile(Map_SuperLib_t *, FILE *)");
                }
                iVar2 = Map_CanonComputeSlow
                                  (uTruthsIn,pLib->nVarsMax,pLib->nVarsMax,pGate->uTruth,
                                   pGate->uPhases,local_17b0);
                *(uint *)&pGate->field_0x4 = *(uint *)&pGate->field_0x4 & 0xfffffff | iVar2 << 0x1c;
                Map_SuperTableInsertC(pLib->tTableC,local_17b0,pGate);
                p_00 = local_17c0;
                if ((local_17c0 == (ProgressBar *)0x0) || (local_17c0->nItemsNext <= (int)uVar12)) {
                  Extra_ProgressBarUpdate_int(local_17c0,uVar12,(char *)0x0);
                }
                pcVar5 = fgets((char *)local_13b8,5000,__stream);
                uVar4 = uVar12;
              } while (pcVar5 != (char *)0x0);
            }
LAB_00400945:
            Extra_ProgressBarStop(p_00);
            pLib->nSupersAll = uVar12;
            iVar2 = 1;
            if (uVar12 != local_17cc) {
              printf("The number of gates read (%d) is different what the file says (%d).\n",
                     (ulong)local_17cc,(ulong)uVar12);
            }
            goto LAB_004005ab;
          }
          pcVar5 = "Suspicious number of gates (%d).\n";
        }
        iVar2 = 0;
        printf(pcVar5);
        goto LAB_004005ab;
      }
      pcVar9 = "Cannot read genlib file \"%s\".\n";
    }
  }
  iVar2 = 0;
  printf(pcVar9,pcVar5);
LAB_004005ab:
  fclose(__stream);
  return iVar2;
}

Assistant:

int Map_LibraryRead( Map_SuperLib_t * pLib, char * pFileName )
{
    FILE * pFile;
    int Status;
    // read the beginning of the file
    assert( pLib->pGenlib == NULL );
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Cannot open input file \"%s\".\n", pFileName );
        return 0;
    }
    Status = Map_LibraryReadFile( pLib, pFile );
    fclose( pFile );
//    Map_LibraryPrintClasses( pLib );
    return Status;
}